

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::removeUnusedMaterials(Geometry *this)

{
  int32 *piVar1;
  ushort uVar2;
  uint32 uVar3;
  int iVar4;
  MeshHeader *pMVar5;
  Material *pMVar6;
  undefined8 uVar7;
  Triangle *pTVar8;
  Material **ppMVar9;
  MeshHeader *pMVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int32 numMeshes;
  long lVar14;
  MeshHeader *pMVar15;
  long lVar16;
  MeshHeader *pMVar17;
  
  pMVar5 = this->meshHeader;
  if (pMVar5 == (MeshHeader *)0x0) {
    return;
  }
  if (pMVar5->numMeshes != 0) {
    lVar11 = 0;
    do {
      if (*(long *)((long)&pMVar5[1].flags + lVar11) == 0) {
        return;
      }
      lVar11 = lVar11 + 0x18;
    } while ((ulong)pMVar5->numMeshes * 0x18 != lVar11);
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 635"
  ;
  lVar11 = (*DAT_00148858)((long)(this->matList).numMaterials << 2,0x1000f);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 637"
  ;
  ppMVar9 = (Material **)(*DAT_00148858)((long)(this->matList).numMaterials << 3,0x30007);
  uVar2 = pMVar5->numMeshes;
  if ((ulong)uVar2 == 0) {
    numMeshes = 0;
  }
  else {
    uVar12 = 0;
    numMeshes = 0;
    do {
      if (*(int *)((long)pMVar5 + uVar12 * 0x18 + 0x18) != 0) {
        ppMVar9[numMeshes] = *(Material **)((long)pMVar5 + uVar12 * 0x18 + 0x20);
        pMVar6 = *(Material **)((long)pMVar5 + uVar12 * 0x18 + 0x20);
        piVar1 = &pMVar6->refCount;
        *piVar1 = *piVar1 + 1;
        lVar16 = (long)(this->matList).numMaterials;
        if (lVar16 < 1) {
          lVar16 = -4;
        }
        else {
          lVar14 = 0;
          do {
            if ((this->matList).materials[lVar14] == pMVar6) goto LAB_0010b8c7;
            lVar14 = lVar14 + 1;
          } while (lVar16 != lVar14);
          lVar14 = -1;
LAB_0010b8c7:
          lVar16 = (long)(int)lVar14 << 2;
        }
        *(int32 *)(lVar11 + lVar16) = numMeshes;
        numMeshes = numMeshes + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar2);
  }
  if (0 < (this->matList).numMaterials) {
    lVar16 = 0;
    do {
      Material::destroy((this->matList).materials[lVar16]);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->matList).numMaterials);
  }
  (*DAT_00148850)((this->matList).materials);
  (this->matList).materials = ppMVar9;
  (this->matList).space = (this->matList).numMaterials;
  (this->matList).numMaterials = numMeshes;
  this->meshHeader = (MeshHeader *)0x0;
  pMVar10 = allocateMeshes(this,numMeshes,pMVar5->totalIndices,0);
  pMVar10->flags = pMVar5->flags;
  pMVar17 = pMVar10 + 1;
  uVar2 = pMVar5->numMeshes;
  if (uVar2 != 0) {
    lVar16 = 0;
    pMVar15 = pMVar17;
    do {
      uVar3 = *(uint32 *)((long)&pMVar5[1].totalIndices + lVar16);
      if (uVar3 != 0) {
        pMVar15->totalIndices = uVar3;
        uVar7 = *(undefined8 *)((long)&pMVar5[2].flags + lVar16);
        pMVar15[1].flags = (int)uVar7;
        pMVar15[1].numMeshes = (short)((ulong)uVar7 >> 0x20);
        pMVar15[1].serialNum = (short)((ulong)uVar7 >> 0x30);
        pMVar15 = (MeshHeader *)&pMVar15[1].totalIndices;
      }
      lVar16 = lVar16 + 0x18;
    } while ((ulong)uVar2 * 0x18 != lVar16);
  }
  MeshHeader::setupIndices(pMVar10);
  if (pMVar5->numMeshes != 0) {
    uVar12 = 0;
    pMVar10 = pMVar5;
    do {
      uVar13 = (ulong)pMVar10[1].totalIndices;
      if (uVar13 != 0) {
        memcpy(*(void **)pMVar17,*(void **)(pMVar10 + 1),uVar13 * 2);
        pMVar17 = (MeshHeader *)&pMVar17[1].totalIndices;
      }
      uVar12 = uVar12 + 1;
      pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
    } while (uVar12 < pMVar5->numMeshes);
  }
  (*DAT_00148850)(pMVar5);
  iVar4 = this->numTriangles;
  if (0 < (long)iVar4) {
    pTVar8 = this->triangles;
    lVar16 = 0;
    do {
      pTVar8[lVar16].matId = *(uint16 *)(lVar11 + (ulong)pTVar8[lVar16].matId * 4);
      lVar16 = lVar16 + 1;
    } while (iVar4 != lVar16);
  }
  (*DAT_00148850)(lVar11);
  return;
}

Assistant:

void
Geometry::removeUnusedMaterials(void)
{
	if(this->meshHeader == nil)
		return;
	MeshHeader *mh = this->meshHeader;
	Mesh *m = mh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++)
		if(m[i].indices == nil)
			return;

	int32 *map = rwNewT(int32, this->matList.numMaterials,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	Material **materials = rwNewT(Material*,this->matList.numMaterials,
		MEMDUR_EVENT | ID_MATERIAL);
	int32 numMaterials = 0;
	/* Build new material list and map */
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		materials[numMaterials] = m[i].material;
		m[i].material->addRef();
		int32 oldid = this->matList.findIndex(m[i].material);
		map[oldid] = numMaterials;
		numMaterials++;
	}
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		this->matList.materials[i]->destroy();
	rwFree(this->matList.materials);
	this->matList.materials = materials;
	this->matList.space = this->matList.numMaterials;
	this->matList.numMaterials = numMaterials;

	/* Build new meshes */
	this->meshHeader = nil;
	MeshHeader *newmh = this->allocateMeshes(numMaterials, mh->totalIndices, 0);
	newmh->flags = mh->flags;
	Mesh *newm = newmh->getMeshes();
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		newm->numIndices = m[i].numIndices;
		newm->material = m[i].material;
		newm++;
	}
	newmh->setupIndices();
	/* Copy indices */
	newm = newmh->getMeshes();;
	for(uint32 i = 0; i < mh->numMeshes; i++){
		if(m[i].numIndices <= 0)
			continue;
		memcpy(newm->indices, m[i].indices,
		       m[i].numIndices*sizeof(*m[i].indices));
		newm++;
	}
	rwFree(mh);

	/* Remap triangle material IDs */
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = map[this->triangles[i].matId];
	rwFree(map);
}